

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite.h
# Opt level: O2

void __thiscall
wallet::SQLiteCursor::SQLiteCursor
          (SQLiteCursor *this,vector<std::byte,_std::allocator<std::byte>_> start_range,
          vector<std::byte,_std::allocator<std::byte>_> end_range)

{
  long lVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  pointer pbVar5;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (this->super_DatabaseCursor)._vptr_DatabaseCursor = (_func_int **)&PTR__SQLiteCursor_01147c90;
  this->m_cursor_stmt = (sqlite3_stmt *)0x0;
  pbVar5 = (pointer)in_RSI[1];
  (this->m_prefix_range_start).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)*in_RSI;
  (this->m_prefix_range_start).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = pbVar5;
  (this->m_prefix_range_start).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)in_RSI[2];
  in_RSI[2] = 0;
  *in_RSI = 0;
  in_RSI[1] = 0;
  uVar2 = *(undefined4 *)((long)in_RDX + 4);
  uVar3 = *(undefined4 *)(in_RDX + 1);
  uVar4 = *(undefined4 *)((long)in_RDX + 0xc);
  *(undefined4 *)
   &(this->m_prefix_range_end).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_start = *(undefined4 *)in_RDX;
  *(undefined4 *)
   ((long)&(this->m_prefix_range_end).super__Vector_base<std::byte,_std::allocator<std::byte>_>.
           _M_impl.super__Vector_impl_data._M_start + 4) = uVar2;
  *(undefined4 *)
   &(this->m_prefix_range_end).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
    super__Vector_impl_data._M_finish = uVar3;
  *(undefined4 *)
   ((long)&(this->m_prefix_range_end).super__Vector_base<std::byte,_std::allocator<std::byte>_>.
           _M_impl.super__Vector_impl_data._M_finish + 4) = uVar4;
  (this->m_prefix_range_end).super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)in_RDX[2];
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    *in_RDX = 0;
    in_RDX[1] = 0;
    in_RDX[2] = 0;
    return;
  }
  __stack_chk_fail();
}

Assistant:

explicit SQLiteCursor(std::vector<std::byte> start_range, std::vector<std::byte> end_range)
        : m_prefix_range_start(std::move(start_range)),
        m_prefix_range_end(std::move(end_range))
    {}